

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::Texture3DLodControlCase::iterate(Texture3DLodControlCase *this)

{
  uint uVar1;
  Texture3D *pTVar2;
  RenderContext *context;
  TestLog *pTVar3;
  int height;
  undefined1 auVar4 [8];
  int iVar5;
  int iVar6;
  deUint32 dVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RenderTarget *pRVar10;
  size_t __n;
  Surface *pSVar11;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  char *description;
  int iVar12;
  int iVar13;
  int iVar14;
  PixelFormat *format;
  allocator<char> local_4d7;
  allocator<char> local_4d6;
  allocator<char> local_4d5;
  int local_4d4;
  TextureFormat *local_4d0;
  int local_4c8;
  int local_4c4;
  RandomViewport viewport;
  int local_4a8;
  vector<float,_std::allocator<float>_> texCoord;
  LodPrecision lodPrec;
  Texture3DView local_450;
  ConstPixelBufferAccess local_440;
  PixelBufferAccess local_418;
  Texture3D *local_3e8;
  PixelBufferAccess local_3e0;
  Surface referenceFrame;
  Surface renderedFrame;
  PixelBufferAccess local_388;
  Surface errorMask;
  undefined1 local_348 [32];
  _func_int **pp_Stack_328;
  BVec4 local_320;
  LogImage local_318;
  undefined1 local_284 [76];
  _func_int **pp_Stack_238;
  size_type local_230;
  int aiStack_228 [2];
  int local_220;
  anon_union_16_3_1194ccdc_for_v local_21c [2];
  undefined1 local_1f0 [8];
  _func_int **pp_Stack_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  int local_1d0;
  anon_union_16_3_1194ccdc_for_v local_1cc [21];
  TextureFormatInfo fmtInfo;
  long lVar9;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar5);
  pTVar2 = this->m_texture;
  local_4d0 = (TextureFormat *)&pTVar2->m_refTexture;
  tcu::getTextureFormatInfo(&fmtInfo,local_4d0);
  iVar5 = (pTVar2->m_refTexture).m_width;
  iVar12 = (pTVar2->m_refTexture).m_height;
  local_3e8 = pTVar2;
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  dVar7 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar6),iVar5 << 2,iVar12 << 2,dVar7)
  ;
  local_4c4 = viewport.width / 4;
  local_4c8 = viewport.height / 4;
  tcu::Surface::Surface(&renderedFrame,viewport.width,viewport.height);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_284,TEXTURETYPE_3D);
  glu::mapGLSampler((Sampler *)local_1f0,0x812f,0x812f,0x812f,this->m_minFilter,0x2600);
  local_220 = local_1d0;
  local_230 = local_1e0._M_allocated_capacity;
  aiStack_228[0] = local_1e0._8_4_;
  aiStack_228[1] = local_1e0._12_4_;
  local_284._68_8_ = local_1f0;
  pp_Stack_238 = pp_Stack_1e8;
  local_21c[0]._0_8_ = local_1cc[0]._0_8_;
  local_21c[0]._8_8_ = local_1cc[0]._8_8_;
  local_21c[1]._0_8_ = local_1cc[1]._0_8_;
  local_284._4_4_ = glu::TextureTestUtil::getSamplerType(*local_4d0);
  local_284._52_4_ = fmtInfo.lookupBias.m_data[0];
  local_284._56_4_ = fmtInfo.lookupBias.m_data[1];
  local_284._60_4_ = fmtInfo.lookupBias.m_data[2];
  local_284._64_4_ = fmtInfo.lookupBias.m_data[3];
  local_284._36_4_ = fmtInfo.lookupScale.m_data[0];
  local_284._40_4_ = fmtInfo.lookupScale.m_data[1];
  local_284._44_4_ = fmtInfo.lookupScale.m_data[2];
  local_284._48_4_ = fmtInfo.lookupScale.m_data[3];
  (**(code **)(lVar9 + 0xb8))(0x806f,this->m_texture->m_glTexture);
  (**(code **)(lVar9 + 0x1360))(0x806f,0x2802,0x812f);
  (**(code **)(lVar9 + 0x1360))(0x806f,0x2803,0x812f);
  (**(code **)(lVar9 + 0x1360))(0x806f,0x8072,0x812f);
  (**(code **)(lVar9 + 0x1360))(0x806f,0x2801,this->m_minFilter);
  (**(code **)(lVar9 + 0x1360))(0x806f,0x2800,0x2600);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"After texture setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureMipmapTests.cpp"
                  ,0x86c);
  local_4a8 = 0;
  for (iVar5 = 0; iVar5 != 4; iVar5 = iVar5 + 1) {
    local_4d0 = (TextureFormat *)CONCAT44(local_4d0._4_4_,iVar5 * local_4c8);
    iVar6 = 0;
    iVar12 = 0;
    for (iVar14 = 0; iVar14 != 4; iVar14 = iVar14 + 1) {
      iVar13 = viewport.width + iVar12;
      if (iVar14 != 3) {
        iVar13 = local_4c4;
      }
      iVar8 = viewport.height - (int)local_4d0;
      if (iVar5 != 3) {
        iVar8 = local_4c8;
      }
      getBasicTexCoord3D(&texCoord,local_4a8 + iVar14);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                (this,(ulong)(uint)(local_4a8 + iVar14));
      (**(code **)(lVar9 + 0x1a00))(viewport.x + iVar6,viewport.y + (int)local_4d0,iVar13,iVar8);
      iVar12 = iVar12 - local_4c4;
      iVar6 = iVar6 + local_4c4;
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (&this->m_renderer,0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(RenderParams *)local_284);
    }
    local_4a8 = local_4a8 + 4;
  }
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_1f0,&renderedFrame);
  glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)local_1f0);
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  uVar1 = this->m_minFilter;
  tcu::Surface::Surface(&referenceFrame,viewport.width,viewport.height);
  tcu::Surface::Surface(&errorMask,viewport.width,viewport.height);
  tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_348);
  format = &pRVar10->m_pixelFormat;
  lodPrec.rule = RULE_OPENGL;
  lodPrec.derivateBits = 0x16;
  lodPrec.lodBits = 0x10;
  local_348._0_4_ = 0x14;
  local_348._4_4_ = 0x14;
  local_348._8_4_ = 0x14;
  local_348._12_4_ = 0x10;
  local_348._16_4_ = 0x10;
  local_348._20_4_ = 0x10;
  local_418.super_ConstPixelBufferAccess.m_format.order = format->redBits;
  local_418.super_ConstPixelBufferAccess.m_format.type = format->greenBits;
  local_418.super_ConstPixelBufferAccess.m_size.m_data[0] = (pRVar10->m_pixelFormat).blueBits;
  local_418.super_ConstPixelBufferAccess.m_size.m_data[1] = (pRVar10->m_pixelFormat).alphaBits;
  tcu::operator-((tcu *)&local_440,(Vector<int,_4> *)&local_418,((uVar1 & 0xfffffffe) == 0x2702) + 1
                );
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&local_3e0,0);
  tcu::max<int,4>((tcu *)&local_318,(Vector<int,_4> *)&local_440,(Vector<int,_4> *)&local_3e0);
  tcu::computeFixedPointThreshold((tcu *)local_1f0,(IVec4 *)&local_318);
  local_348._24_8_ = local_1f0;
  pp_Stack_328 = pp_Stack_1e8;
  glu::TextureTestUtil::getCompareMask(format);
  auVar4 = local_1f0;
  local_320.m_data[0] = (bool)local_1f0[0];
  local_320.m_data[1] = (bool)local_1f0[1];
  local_320.m_data[2] = (bool)local_1f0[2];
  local_320.m_data[3] = (bool)local_1f0[3];
  lodPrec.derivateBits = 10;
  lodPrec.lodBits = 8;
  iVar5 = 0;
  local_4d4 = 0;
  __n = 0;
  local_1f0 = auVar4;
  while (iVar12 = (int)__n, iVar12 != 4) {
    local_4d0 = (TextureFormat *)CONCAT44(local_4d0._4_4_,iVar12 * local_4c8);
    iVar14 = 0;
    iVar6 = 0;
    iVar13 = 0;
    while( true ) {
      if (iVar13 == 4) break;
      iVar8 = viewport.width + iVar6;
      if (iVar13 != 3) {
        iVar8 = local_4c4;
      }
      height = viewport.height - (int)local_4d0;
      if (iVar12 != 3) {
        height = local_4c8;
      }
      getBasicTexCoord3D(&texCoord,iVar5 + iVar13);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                (this,local_284,(ulong)(uint)(iVar5 + iVar13));
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)local_1f0,&referenceFrame,format,iVar14,(int)local_4d0,iVar8,
                 height);
      local_318.m_name._M_dataplus._M_p._0_4_ = (local_3e8->m_refTexture).m_view.m_numLevels;
      local_318.m_name._M_string_length = (size_type)(local_3e8->m_refTexture).m_view.m_levels;
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)local_1f0,(Texture3DView *)&local_318,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(ReferenceParams *)local_284);
      tcu::Surface::getAccess((PixelBufferAccess *)&local_318,&renderedFrame);
      tcu::getSubregion((PixelBufferAccess *)local_1f0,(PixelBufferAccess *)&local_318,iVar14,
                        (int)local_4d0,iVar8,height);
      tcu::Surface::getAccess(&local_418,&referenceFrame);
      tcu::getSubregion((PixelBufferAccess *)&local_440,&local_418,iVar14,(int)local_4d0,iVar8,
                        height);
      tcu::Surface::getAccess(&local_388,&errorMask);
      tcu::getSubregion(&local_3e0,&local_388,iVar14,(int)local_4d0,iVar8,height);
      local_450.m_numLevels = (this->m_texture->m_refTexture).m_view.m_numLevels;
      local_450.m_levels = (this->m_texture->m_refTexture).m_view.m_levels;
      iVar8 = glu::TextureTestUtil::computeTextureLookupDiff
                        ((ConstPixelBufferAccess *)local_1f0,&local_440,&local_3e0,&local_450,
                         texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,(ReferenceParams *)local_284,
                         (LookupPrecision *)local_348,&lodPrec,
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                         m_watchDog);
      local_4d4 = local_4d4 + iVar8;
      iVar6 = iVar6 - local_4c4;
      iVar14 = iVar14 + local_4c4;
      iVar13 = iVar13 + 1;
    }
    iVar5 = iVar5 + 4;
    __n = (size_t)(iVar12 + 1);
  }
  if (0 < local_4d4) {
    local_1f0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1e8);
    std::operator<<((ostream *)&pp_Stack_1e8,"ERROR: Image verification failed, found ");
    std::ostream::operator<<((ostringstream *)&pp_Stack_1e8,local_4d4);
    std::operator<<((ostream *)&pp_Stack_1e8," invalid pixels!");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1e8);
  }
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"Result",(allocator<char> *)&local_450);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_418,"Verification result",&local_4d5);
  tcu::LogImageSet::LogImageSet((LogImageSet *)&local_318,(string *)&local_440,(string *)&local_418)
  ;
  iVar5 = (int)pTVar3;
  tcu::LogImageSet::write((LogImageSet *)&local_318,iVar5,__buf,__n);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"Rendered",&local_4d6);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_388,"Rendered image",&local_4d7);
  pSVar11 = &renderedFrame;
  tcu::LogImage::LogImage
            ((LogImage *)local_1f0,(string *)&local_3e0,(string *)&local_388,pSVar11,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_1f0,iVar5,__buf_00,(size_t)pSVar11);
  tcu::LogImage::~LogImage((LogImage *)local_1f0);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_3e0);
  tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_318);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_440);
  if (0 < local_4d4) {
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,"Reference",(allocator<char> *)&local_450);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_418,"Ideal reference",&local_4d5);
    pSVar11 = &referenceFrame;
    tcu::LogImage::LogImage
              ((LogImage *)local_1f0,(string *)&local_440,(string *)&local_418,pSVar11,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    iVar5 = (int)pTVar3;
    tcu::LogImage::write((LogImage *)local_1f0,iVar5,__buf_01,(size_t)pSVar11);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"ErrorMask",&local_4d6);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"Error mask",&local_4d7)
    ;
    pSVar11 = &errorMask;
    tcu::LogImage::LogImage
              (&local_318,(string *)&local_3e0,(string *)&local_388,pSVar11,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_318,iVar5,__buf_02,(size_t)pSVar11);
    tcu::LogImage::~LogImage(&local_318);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_3e0);
    tcu::LogImage::~LogImage((LogImage *)local_1f0);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_440);
  }
  tcu::TestLog::endImageSet(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log)
  ;
  description = "Pass";
  if (local_4d4 != 0) {
    description = "Image verification failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(local_4d4 != 0),
             description);
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&referenceFrame);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
  tcu::Surface::~Surface(&renderedFrame);
  return STOP;
}

Assistant:

Texture3DLodControlCase::IterateResult Texture3DLodControlCase::iterate (void)
{
	const glw::Functions&			gl					= m_context.getRenderContext().getFunctions();

	const deUint32					wrapS				= GL_CLAMP_TO_EDGE;
	const deUint32					wrapT				= GL_CLAMP_TO_EDGE;
	const deUint32					wrapR				= GL_CLAMP_TO_EDGE;
	const deUint32					magFilter			= GL_NEAREST;
	const tcu::Texture3D&			refTexture			= m_texture->getRefTexture();
	const tcu::TextureFormat&		texFmt				= refTexture.getFormat();
	const tcu::TextureFormatInfo	fmtInfo				= tcu::getTextureFormatInfo(texFmt);
	const int						texWidth			= refTexture.getWidth();
	const int						texHeight			= refTexture.getHeight();

	const tcu::RenderTarget&		renderTarget		= m_context.getRenderContext().getRenderTarget();
	const RandomViewport			viewport			(renderTarget, texWidth*4, texHeight*4, deStringHash(getName()));

	// Viewport is divided into 4x4 grid.
	const int						gridWidth			= 4;
	const int						gridHeight			= 4;
	const int						cellWidth			= viewport.width / gridWidth;
	const int						cellHeight			= viewport.height / gridHeight;

	tcu::Surface					renderedFrame		(viewport.width, viewport.height);
	vector<float>					texCoord;
	ReferenceParams					sampleParams		(TEXTURETYPE_3D);

	// Sampling parameters.
	sampleParams.sampler		= glu::mapGLSampler(wrapS, wrapT, wrapR, m_minFilter, magFilter);
	sampleParams.samplerType	= getSamplerType(texFmt);
	sampleParams.colorBias		= fmtInfo.lookupBias;
	sampleParams.colorScale		= fmtInfo.lookupScale;

	// Bind texture and setup sampler parameters.
	gl.bindTexture	(GL_TEXTURE_3D, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_S,		wrapS);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_T,		wrapT);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_WRAP_R,		wrapR);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			int		curX		= cellWidth*gridX;
			int		curY		= cellHeight*gridY;
			int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
			int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
			int		cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			getBasicTexCoord3D(texCoord, cellNdx);

			setTextureParams(cellNdx);

			// Render with GL.
			gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
			m_renderer.renderQuad(0, &texCoord[0], sampleParams);
		}
	}

	// Read result.
	glu::readPixels(m_context.getRenderContext(), viewport.x, viewport.y, renderedFrame.getAccess());

	// Compare and log
	{
		const tcu::PixelFormat&	pixelFormat		= m_context.getRenderTarget().getPixelFormat();
		const bool				isTrilinear		= m_minFilter == GL_NEAREST_MIPMAP_LINEAR || m_minFilter == GL_LINEAR_MIPMAP_LINEAR;
		tcu::Surface			referenceFrame	(viewport.width, viewport.height);
		tcu::Surface			errorMask		(viewport.width, viewport.height);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_OPENGL);
		int						numFailedPixels	= 0;

		lookupPrec.coordBits		= tcu::IVec3(20, 20, 20);
		lookupPrec.uvwBits			= tcu::IVec3(16, 16, 16); // Doesn't really matter since pixels are unicolored.
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat) - (isTrilinear ? 2 : 1), tcu::IVec4(0)));
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= 8;

		for (int gridY = 0; gridY < gridHeight; gridY++)
		{
			for (int gridX = 0; gridX < gridWidth; gridX++)
			{
				const int		curX		= cellWidth*gridX;
				const int		curY		= cellHeight*gridY;
				const int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
				const int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
				const int		cellNdx		= gridY*gridWidth + gridX;

				getBasicTexCoord3D(texCoord, cellNdx);
				getReferenceParams(sampleParams, cellNdx);

				// Render ideal result
				sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat, curX, curY, curW, curH),
							  refTexture, &texCoord[0], sampleParams);

				// Compare this cell
				numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
															m_texture->getRefTexture(), &texCoord[0], sampleParams,
															lookupPrec, lodPrec, m_testCtx.getWatchDog());
			}
		}

		if (numFailedPixels > 0)
			m_testCtx.getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		m_testCtx.getLog() << TestLog::ImageSet("Result", "Verification result")
							<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_testCtx.getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
								<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_testCtx.getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image verification failed");
		}
	}

	return STOP;
}